

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid,REF_INT nequ,REF_DBL *flux,REF_DBL *res)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GLOB *pRVar4;
  REF_DBL *pRVar5;
  REF_INT *pRVar6;
  uint uVar7;
  int iVar8;
  REF_STATUS RVar9;
  REF_DBL *scalar;
  REF_DBL *grad;
  int iVar10;
  int iVar11;
  int iVar12;
  REF_DBL *pRVar13;
  long lVar14;
  undefined8 uVar15;
  REF_INT cell;
  long lVar16;
  undefined1 *puVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  int iVar21;
  long lVar22;
  undefined4 *puVar23;
  int iVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  REF_DBL cell_vol;
  REF_DBL *xyzs [4];
  REF_DBL flux_grad [3];
  REF_INT nodes [27];
  REF_DBL tet_flux [4];
  REF_DBL macro_flux [10];
  REF_DBL macro_xyz [10] [3];
  double local_250;
  REF_DBL *local_248 [4];
  REF_DBL local_228 [4];
  REF_INT local_208 [28];
  REF_DBL local_198 [4];
  REF_DBL aRStack_178 [4];
  double adStack_158 [6];
  REF_DBL local_128 [12];
  undefined1 local_c8 [152];
  
  ref_node = ref_grid->node;
  iVar1 = ref_node->max;
  if ((long)iVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x233,
           "ref_phys_cc_fv_embed","malloc direqu of REF_DBL negative");
    RVar9 = 1;
  }
  else {
    ref_cell = ref_grid->cell[8];
    scalar = (REF_DBL *)malloc((long)iVar1 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar20 = "malloc direqu of REF_DBL NULL";
      uVar15 = 0x233;
    }
    else {
      grad = (REF_DBL *)malloc((ulong)(uint)(iVar1 * 3) << 3);
      if (grad != (REF_DBL *)0x0) {
        iVar1 = nequ * 3;
        iVar10 = 0;
        lVar14 = 0;
        do {
          if (0 < nequ) {
            iVar24 = 0;
            iVar21 = iVar10;
            do {
              iVar8 = ref_node->max;
              if (0 < (long)iVar8) {
                pRVar4 = ref_node->global;
                lVar18 = 0;
                iVar11 = iVar21;
                do {
                  if (-1 < pRVar4[lVar18]) {
                    scalar[lVar18] = flux[iVar11];
                  }
                  lVar18 = lVar18 + 1;
                  iVar11 = iVar11 + iVar1;
                } while (iVar8 != lVar18);
              }
              uVar7 = ref_recon_gradient(ref_grid,scalar,grad,REF_RECON_L2PROJECTION);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x23b,"ref_phys_cc_fv_embed",(ulong)uVar7,"grad");
                return uVar7;
              }
              if (0 < ref_cell->max) {
                iVar8 = (int)lVar14 * nequ + iVar24;
                cell = 0;
                do {
                  RVar9 = ref_cell_nodes(ref_cell,cell,local_208);
                  if (RVar9 == 0) {
                    iVar11 = ref_cell->node_per;
                    lVar18 = (long)iVar11;
                    if (0 < lVar18) {
                      pRVar5 = ref_node->real;
                      pRVar13 = local_128;
                      lVar16 = 0;
                      do {
                        iVar12 = local_208[lVar16];
                        lVar19 = 0;
                        do {
                          pRVar13[lVar19] = pRVar5[(long)iVar12 * 0xf + lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 3);
                        lVar16 = lVar16 + 1;
                        pRVar13 = pRVar13 + 3;
                      } while (lVar16 != lVar18);
                    }
                    iVar12 = ref_cell->edge_per;
                    lVar16 = (long)iVar12;
                    if (0 < lVar16) {
                      pRVar6 = ref_cell->e2n;
                      pRVar13 = ref_node->real;
                      puVar17 = local_c8;
                      lVar19 = 0;
                      do {
                        iVar2 = local_208[pRVar6[lVar19 * 2]];
                        iVar3 = local_208[pRVar6[lVar19 * 2 + 1]];
                        lVar22 = 0;
                        do {
                          *(double *)(puVar17 + lVar22 * 8) =
                               (pRVar13[(long)iVar2 * 0xf + lVar22] +
                               pRVar13[(long)iVar3 * 0xf + lVar22]) * 0.5;
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 3);
                        lVar19 = lVar19 + 1;
                        puVar17 = puVar17 + 0x18;
                      } while (lVar19 != lVar16);
                    }
                    if (0 < iVar11) {
                      lVar19 = 0;
                      do {
                        aRStack_178[lVar19] =
                             flux[(local_208[lVar19] * 3 + (int)lVar14) * nequ + iVar24];
                        lVar19 = lVar19 + 1;
                      } while (lVar18 != lVar19);
                    }
                    if (0 < iVar12) {
                      pRVar6 = ref_cell->e2n;
                      pRVar13 = ref_node->real;
                      lVar18 = 0;
                      do {
                        iVar11 = local_208[pRVar6[lVar18 * 2]];
                        iVar12 = local_208[pRVar6[lVar18 * 2 + 1]];
                        dVar25 = (flux[iVar11 * iVar1 + iVar8] + flux[iVar12 * iVar1 + iVar8]) * 0.5
                        ;
                        adStack_158[lVar18] = dVar25;
                        dVar27 = 0.0;
                        lVar19 = 0;
                        dVar26 = 0.0;
                        do {
                          dVar28 = pRVar13[(long)iVar12 * 0xf + lVar19] -
                                   pRVar13[(long)iVar11 * 0xf + lVar19];
                          dVar26 = dVar26 + grad[(long)iVar11 * 3 + lVar19] * dVar28;
                          dVar27 = dVar27 + dVar28 * grad[(long)iVar12 * 3 + lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 3);
                        adStack_158[lVar18] = (dVar26 - dVar27) * 0.125 + dVar25;
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != lVar16);
                    }
                    puVar23 = &DAT_0022e700;
                    lVar18 = 0;
                    do {
                      iVar11 = ref_cell->node_per;
                      if (0 < (long)iVar11) {
                        lVar16 = 0;
                        do {
                          iVar12 = puVar23[lVar16];
                          local_248[lVar16] = local_128 + (long)iVar12 * 3;
                          local_198[lVar16] = aRStack_178[iVar12];
                          lVar16 = lVar16 + 1;
                        } while (iVar11 != lVar16);
                      }
                      uVar7 = ref_node_xyz_vol(local_248,&local_250);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x267,"ref_phys_cc_fv_embed",(ulong)uVar7,"vol");
                        return uVar7;
                      }
                      uVar7 = ref_node_xyz_grad(local_248,local_198,local_228);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x268,"ref_phys_cc_fv_embed",(ulong)uVar7,"grad");
                        return uVar7;
                      }
                      iVar11 = ref_cell->node_per;
                      if (0 < (long)iVar11) {
                        dVar25 = local_228[lVar14];
                        lVar16 = 0;
                        do {
                          iVar12 = local_208[lVar16] * nequ + iVar24;
                          res[iVar12] = res[iVar12] + dVar25 * 0.25 * local_250;
                          lVar16 = lVar16 + 1;
                        } while (iVar11 != lVar16);
                      }
                      lVar18 = lVar18 + 1;
                      puVar23 = puVar23 + 4;
                    } while (lVar18 != 8);
                  }
                  cell = cell + 1;
                } while (cell < ref_cell->max);
              }
              iVar24 = iVar24 + 1;
              iVar21 = iVar21 + 1;
            } while (iVar24 != nequ);
          }
          lVar14 = lVar14 + 1;
          iVar10 = iVar10 + nequ;
          if (lVar14 == 3) {
            free(grad);
            free(scalar);
            uVar7 = ref_node_ghost_dbl(ref_node,res,nequ);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x275,"ref_phys_cc_fv_embed",(ulong)uVar7,"ghost res");
              return uVar7;
            }
            return 0;
          }
        } while( true );
      }
      pcVar20 = "malloc fluxgrad of REF_DBL NULL";
      uVar15 = 0x234;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar15,
           "ref_phys_cc_fv_embed",pcVar20);
    RVar9 = 2;
  }
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid, REF_INT nequ,
                                        REF_DBL *flux, REF_DBL *res) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, equ, dir, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_vol, flux_grad[3];
  REF_DBL tet_flux[4], *xyzs[4];
  REF_DBL macro_flux[10], macro_xyz[10][3];
  REF_INT m2n[8][4] = {{0, 4, 5, 6}, {1, 8, 7, 4}, {2, 7, 9, 6}, {3, 6, 9, 8},
                       {4, 6, 9, 5}, {7, 8, 9, 4}, {7, 9, 5, 4}, {8, 6, 9, 4}};
  REF_INT n0, n1, macro;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT node;
  REF_DBL sdot0, sdot1, *direqu, *fluxgrad;
  REF_BOOL high_order = REF_TRUE;
  /* macro node [edge]
                                  3------9[5]--------2
                                 / \              . /
                                /   \          .   /
                               /     \      .     /
                              /       \  .       /
                             /        .\        /
                          6[2]   5[1]  8[4]   7[3]
                           /    .        \    /
                          /  .            \  /
                         /.                \/
                        0------4[0]--------1
  */

  ref_malloc(direqu, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(fluxgrad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (dir = 0; dir < 3; dir++) {
    for (equ = 0; equ < nequ; equ++) {
      each_ref_node_valid_node(ref_node, node) {
        direqu[node] = flux[equ + dir * nequ + 3 * nequ * node];
      }
      RSS(ref_recon_gradient(ref_grid, direqu, fluxgrad, recon), "grad");
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          for (i = 0; i < 3; i++) {
            macro_xyz[cell_node][i] =
                ref_node_xyz(ref_node, i, nodes[cell_node]);
          }
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          for (i = 0; i < 3; i++) {
            macro_xyz[4 + cell_edge][i] = 0.5 * (ref_node_xyz(ref_node, i, n0) +
                                                 ref_node_xyz(ref_node, i, n1));
          }
        }

        each_ref_cell_cell_node(ref_cell, cell_node) {
          i = equ + dir * nequ + 3 * nequ * nodes[cell_node];
          macro_flux[cell_node] = flux[i];
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          macro_flux[4 + cell_edge] =
              0.5 * (flux[equ + dir * nequ + 3 * nequ * n0] +
                     flux[equ + dir * nequ + 3 * nequ * n1]);
          sdot0 = 0.0;
          sdot1 = 0.0;
          for (i = 0; i < 3; i++) {
            sdot0 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n0];
            sdot1 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n1];
          }
          if (high_order) macro_flux[4 + cell_edge] += 0.125 * (sdot0 - sdot1);
        }
        for (macro = 0; macro < 8; macro++) {
          each_ref_cell_cell_node(ref_cell, cell_node) {
            xyzs[cell_node] = macro_xyz[m2n[macro][cell_node]];
            tet_flux[cell_node] = macro_flux[m2n[macro][cell_node]];
          }
          RSS(ref_node_xyz_vol(xyzs, &cell_vol), "vol");
          RSS(ref_node_xyz_grad(xyzs, tet_flux, flux_grad), "grad");
          each_ref_cell_cell_node(ref_cell, cell_node) {
            res[equ + nequ * nodes[cell_node]] +=
                0.25 * flux_grad[dir] * cell_vol;
          }
        }
      }
    }
  }

  ref_free(fluxgrad);
  ref_free(direqu);

  RSS(ref_node_ghost_dbl(ref_node, res, nequ), "ghost res");

  return REF_SUCCESS;
}